

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void server::writedemo(int chan,void *data,int len)

{
  long lVar1;
  int local_28;
  int local_24;
  int stamp [3];
  int len_local;
  void *data_local;
  int chan_local;
  
  if (demorecord != (long *)0x0) {
    local_28 = gamemillis;
    local_24 = chan;
    stamp[0] = len;
    stamp[1] = len;
    unique0x10000092 = data;
    lilswap<int>(&local_28,3);
    (**(code **)(*demorecord + 0x50))(demorecord,&local_28,0xc);
    (**(code **)(*demorecord + 0x50))(demorecord,stack0xffffffffffffffe8,stamp[1]);
    lVar1 = (**(code **)(*demorecord + 0x28))();
    if (maxdemosize << 0x14 <= lVar1) {
      enddemorecord();
    }
  }
  return;
}

Assistant:

void writedemo(int chan, void *data, int len)
    {
        if(!demorecord) return;
        int stamp[3] = { gamemillis, chan, len };
        lilswap(stamp, 3);
        demorecord->write(stamp, sizeof(stamp));
        demorecord->write(data, len);
        if(demorecord->rawtell() >= (maxdemosize<<20)) enddemorecord();
    }